

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReadWriteGraph.h
# Opt level: O3

RWSubgraph * __thiscall dg::dda::ReadWriteGraph::createSubgraph(ReadWriteGraph *this)

{
  iterator __position;
  pointer puVar1;
  _Head_base<0UL,_dg::dda::RWSubgraph_*,_false> local_10;
  
  local_10._M_head_impl = (RWSubgraph *)operator_new(0x50);
  ((local_10._M_head_impl)->name)._M_dataplus._M_p = (pointer)0x0;
  ((local_10._M_head_impl)->name)._M_string_length = 0;
  ((local_10._M_head_impl)->name).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&((local_10._M_head_impl)->name).field_2 + 8) = 0;
  *(undefined8 *)
   &((local_10._M_head_impl)->_bblocks).
    super__Vector_base<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>,_std::allocator<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_>_>
       = 0;
  *(pointer *)
   ((long)&((local_10._M_head_impl)->_bblocks).
           super__Vector_base<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>,_std::allocator<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_>_>
   + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&((local_10._M_head_impl)->_bblocks).
           super__Vector_base<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>,_std::allocator<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_>_>
   + 0x10) = (pointer)0x0;
  *(undefined8 *)
   &((local_10._M_head_impl)->_callers).
    super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl = 0;
  *(pointer *)
   ((long)&((local_10._M_head_impl)->_callers).
           super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> + 8) =
       (pointer)0x0;
  *(pointer *)
   ((long)&((local_10._M_head_impl)->_callers).
           super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> + 0x10) =
       (pointer)0x0;
  ((local_10._M_head_impl)->name)._M_dataplus._M_p =
       (pointer)&((local_10._M_head_impl)->name).field_2;
  ((local_10._M_head_impl)->name).field_2._M_local_buf[0] = '\0';
  __position._M_current =
       (this->_subgraphs).
       super__Vector_base<std::unique_ptr<dg::dda::RWSubgraph,_std::default_delete<dg::dda::RWSubgraph>_>,_std::allocator<std::unique_ptr<dg::dda::RWSubgraph,_std::default_delete<dg::dda::RWSubgraph>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->_subgraphs).
      super__Vector_base<std::unique_ptr<dg::dda::RWSubgraph,_std::default_delete<dg::dda::RWSubgraph>_>,_std::allocator<std::unique_ptr<dg::dda::RWSubgraph,_std::default_delete<dg::dda::RWSubgraph>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<std::unique_ptr<dg::dda::RWSubgraph,std::default_delete<dg::dda::RWSubgraph>>,std::allocator<std::unique_ptr<dg::dda::RWSubgraph,std::default_delete<dg::dda::RWSubgraph>>>>
    ::_M_realloc_insert<dg::dda::RWSubgraph*>
              ((vector<std::unique_ptr<dg::dda::RWSubgraph,std::default_delete<dg::dda::RWSubgraph>>,std::allocator<std::unique_ptr<dg::dda::RWSubgraph,std::default_delete<dg::dda::RWSubgraph>>>>
                *)&this->_subgraphs,__position,&local_10._M_head_impl);
    puVar1 = (this->_subgraphs).
             super__Vector_base<std::unique_ptr<dg::dda::RWSubgraph,_std::default_delete<dg::dda::RWSubgraph>_>,_std::allocator<std::unique_ptr<dg::dda::RWSubgraph,_std::default_delete<dg::dda::RWSubgraph>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    ((__position._M_current)->_M_t).
    super___uniq_ptr_impl<dg::dda::RWSubgraph,_std::default_delete<dg::dda::RWSubgraph>_>._M_t.
    super__Tuple_impl<0UL,_dg::dda::RWSubgraph_*,_std::default_delete<dg::dda::RWSubgraph>_>.
    super__Head_base<0UL,_dg::dda::RWSubgraph_*,_false>._M_head_impl = local_10._M_head_impl;
    puVar1 = (this->_subgraphs).
             super__Vector_base<std::unique_ptr<dg::dda::RWSubgraph,_std::default_delete<dg::dda::RWSubgraph>_>,_std::allocator<std::unique_ptr<dg::dda::RWSubgraph,_std::default_delete<dg::dda::RWSubgraph>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
    (this->_subgraphs).
    super__Vector_base<std::unique_ptr<dg::dda::RWSubgraph,_std::default_delete<dg::dda::RWSubgraph>_>,_std::allocator<std::unique_ptr<dg::dda::RWSubgraph,_std::default_delete<dg::dda::RWSubgraph>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar1;
  }
  return puVar1[-1]._M_t.
         super___uniq_ptr_impl<dg::dda::RWSubgraph,_std::default_delete<dg::dda::RWSubgraph>_>._M_t.
         super__Tuple_impl<0UL,_dg::dda::RWSubgraph_*,_std::default_delete<dg::dda::RWSubgraph>_>.
         super__Head_base<0UL,_dg::dda::RWSubgraph_*,_false>._M_head_impl;
}

Assistant:

RWSubgraph &createSubgraph() {
        _subgraphs.emplace_back(new RWSubgraph());
        return *_subgraphs.back().get();
    }